

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,
          vector<int,_std::allocator<int>_> *p,float x,float y)

{
  pointer piVar1;
  uchar ***pppuVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  int j;
  long lVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar9 = 0.0;
  if (0.0 <= x + -0.5) {
    fVar9 = x + -0.5;
  }
  fVar11 = 0.0;
  if (0.0 <= y + -0.5) {
    fVar11 = y + -0.5;
  }
  uVar8 = -(uint)(fVar9 < (float)(this->width + -1));
  fVar10 = (float)(~uVar8 & (uint)((float)this->width + -1.001) | (uint)fVar9 & uVar8);
  uVar8 = -(uint)(fVar11 < (float)(this->height + -1));
  fVar9 = (float)(~uVar8 & (uint)((float)this->height + -1.001) | (uint)fVar11 & uVar8);
  lVar5 = (long)fVar10;
  lVar6 = (long)fVar9;
  fVar11 = (fVar10 - (float)lVar5) * 4.0;
  fVar9 = (fVar9 - (float)lVar6) * 4.0;
  piVar1 = (p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pppuVar2 = this->img;
  for (lVar7 = 0; lVar7 < this->depth; lVar7 = lVar7 + 1) {
    piVar1[lVar7] = -1;
    puVar3 = pppuVar2[lVar7][lVar6];
    puVar4 = pppuVar2[lVar7][lVar6 + 1];
    piVar1[lVar7] =
         (int)(((float)puVar4[lVar5 + 1] * fVar9 * fVar11 +
               (float)puVar4[lVar5] * (4.0 - fVar11) * fVar9 +
               (float)puVar3[lVar5 + 1] * (4.0 - fVar9) * fVar11 +
               (float)puVar3[lVar5] * (4.0 - fVar11) * (4.0 - fVar9)) * 0.0625);
  }
  return;
}

Assistant:

void getBilinear(std::vector<work_t> &p, float x, float y) const
    {
      long    i, k;
      store_t p0, p1, p2, p3;

      x-=0.5f;
      y-=0.5f;

      if (x < 0)
      {
        x=0;
      }

      if (y < 0)
      {
        y=0;
      }

      if (x >= width-1)
      {
        x=width-1.001f;
      }

      if (y >= height-1)
      {
        y=height-1.001f;
      }

      i=static_cast<long>(x);
      k=static_cast<long>(y);

      x-=i;
      y-=k;

      x*=4;
      y*=4;

      const float s0=(4-x)*(4-y);
      const float s1=x*(4-y);
      const float s2=(4-x)*y;
      const float s3=x*y;

      for (int j=0; j<depth; j++)
      {
        p[j]=ptraits::invalid();

        p0=img[j][k][i];
        p1=img[j][k][i+1];
        p2=img[j][k+1][i];
        p3=img[j][k+1][i+1];

        if (isValidS(p0) && isValidS(p1) && isValidS(p2) && isValidS(p3))
        {
          p[j]=static_cast<work_t>((p0*s0+p1*s1+p2*s2+p3*s3)/16);
        }
      }
    }